

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-app.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_1a1a7::AppInterface::init(AppInterface *this,EVP_PKEY_CTX *ctx)

{
  _Requires<_Callable<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]kbd_audio_keytap3_app_cpp:324:16)>,_function<bool_()>_&>
  pfVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  
  this_00 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)ctx;
  std::function<bool()>::operator=((function<bool_()> *)ctx,(anon_class_8_1_a8a4b3b1 *)ctx);
  std::function<void(std::__cxx11::string_const&)>::operator=
            (this_00,(anon_class_8_1_a8a4b3b1 *)ctx);
  std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)this_00,(anon_class_8_1_a8a4b3b1 *)ctx);
  pfVar1 = std::function<bool()>::operator=
                     ((function<bool_()> *)this_00,(anon_class_8_1_a8a4b3b1 *)ctx);
  return (int)CONCAT71((int7)((ulong)pfVar1 >> 8),1);
}

Assistant:

bool AppInterface::init(State & state) {
    doInit = [&]() {
        state.init();

        return true;
    };

    setData = [&](const std::string & data) {
        //printf("Received some data from the JS layer: %s\n", data.c_str());

        std::stringstream ss(data);

        std::string cmd;
        ss >> cmd;

        if (cmd == "start") {
            if (state.state == State::Idle) {
                int nKeysToCapture = 0;
                if (ss >> nKeysToCapture) {
                    state.recording.nKeysToCapture = nKeysToCapture;
                } else {
                    printf("[!] Failed to parse nKeysToCapture. Using: %d\n", state.recording.nKeysToCapture);
                }

                printf("[+] Starting recording. nKeysToCapture: %d\n", state.recording.nKeysToCapture);
                state.state = State::Recording;
            }
        } else if (cmd == "stop") {
            if (state.state == State::Recording) {
                state.recording.interrupt = true;
            }
            if (state.state == State::Decoding) {
                state.decoding.interrupt = true;
            }
        } else {
            printf("Unknown cmd: %s\n", cmd.c_str());
        }
    };

    getData = [&]() {
        const auto res = state.dataOutput;
        state.dataOutput.clear();
        return res;
    };

    mainLoop = [&]() {
        switch (state.state) {
            case State::Loading:
                {
                    if (state.worker.joinable() == false) {
                        state.dataOutput = "loading";
                        state.worker = std::thread([&]() {
                            const auto tStart = std::chrono::high_resolution_clock::now();

                            const auto filename = state.decoding.pathData + "/./ggwords-6-gram.dat.binary";
                            printf("[+] Loading n-grams from '%s'\n", filename.c_str());

                            if (Cipher::loadFreqMapBinary(filename.c_str(), state.decoding.freqMap6) == false) {
                                printf("[E] Failed to load n-grams\n");
                                return;
                            }

                            const auto tEnd = std::chrono::high_resolution_clock::now();

                            printf("[+] Loading took %4.3f seconds\n", toSeconds(tStart, tEnd));
                            state.workDone = true;
                        });
                    }

                    if (state.workDone) {
                        state.worker.join();
                        state.state = State::Idle;
                        state.dataOutput = "loaded";
                    }
                } break;
            case State::Idle:
                {
                } break;
            case State::Recording:
                {
                    state.recording.init();
                    state.recording.update();

                    if (state.worker.joinable() == false) {
                        state.dataOutput = "recording 0 0";
                        state.worker = std::thread([&]() {
                            const auto tStart = std::chrono::high_resolution_clock::now();

                            while (state.recording.doneRecording == false) {
                                const auto tNow = std::chrono::high_resolution_clock::now();
                                const float tElapsed_s = std::chrono::duration<float>(tNow - tStart).count();

                                state.recording.updateWorker(state.dataOutput, tElapsed_s);

                                std::this_thread::sleep_for(std::chrono::milliseconds(500));
                            }

                            const auto tEnd = std::chrono::high_resolution_clock::now();

                            printf("[+] Recording took %4.3f seconds\n", toSeconds(tStart, tEnd));

                            printf("[+] Finding best cutoff frequency ..\n");
                            state.recording.updateWorker(state.dataOutput, -1.0f);

                            state.recording.doneCutoffSearch = true;
                        });
                    }

                    if (state.recording.doneCutoffSearch) {
                        state.recording.audioLogger.terminate();
                        state.recording.isStarted = false;
                        state.worker.join();

                        // write record.kbd
                        {
                            std::ofstream fout(state.recording.pathOutput, std::ios::binary);
                            if (fout.good() == false) {
                                fprintf(stderr, "Failed to open file '%s'\n", state.recording.pathOutput.c_str());
                                return false;
                            }

                            state.recording.totalSize_bytes = sizeof(state.recording.waveformF[0])*state.recording.waveformF.size();
                            fout.write((char *)(state.recording.waveformF.data()), sizeof(state.recording.waveformF[0])*state.recording.waveformF.size());
                            fout.close();

                            printf("[+] Total data saved: %g MB\n", ((float)(state.recording.totalSize_bytes)/1024.0f/1024.0f));
                        }

                        // write record.wav
                        {
                            drwav_data_format format;
                            format.container = drwav_container_riff;
                            format.format = DR_WAVE_FORMAT_PCM;
                            format.channels = 1;
                            format.sampleRate = kSampleRate;
                            format.bitsPerSample = 16;

                            printf("[+] Writing WAV data ...\n");

                            drwav wav;
                            drwav_init_file_write(&wav, "record.wav", &format, NULL);
                            drwav_uint64 framesWritten = drwav_write_pcm_frames(&wav, state.recording.waveformI16.size(), state.recording.waveformI16.data());

                            printf("[+] WAV frames written = %d\n", (int) framesWritten);

                            drwav_uninit(&wav);
                        }

                        state.dataOutput = "decoding";

                        state.decoding.waveformInput = state.recording.waveformI16;
                        state.state = State::Decoding;
                        printf("[+] Starting decoding\n");
                    }
                } break;
            case State::Decoding:
                {
                    if (state.worker.joinable() == false) {
                        state.workDone = false;
                        state.decoding.interrupt = false;
                        state.worker = std::thread([&]() {
                            TKeyPressCollection keyPresses;
                            {
                                const auto tStart = std::chrono::high_resolution_clock::now();

                                printf("[+] Searching for key presses\n");

                                TWaveform waveformMax;
                                TWaveform waveformThreshold;
                                if (findKeyPresses(getView(state.decoding.waveformInput, 0), keyPresses, waveformThreshold, waveformMax,
                                                   kFindKeysThreshold, kFindKeysHistorySize, kFindKeysHistorySizeReset, kFindKeysRemoveLowPower) == false) {
                                    printf("Failed to detect keypresses\n");
                                    return;
                                }

                                const auto tEnd = std::chrono::high_resolution_clock::now();

                                printf("[+] Detected a total of %d potential key presses\n", (int) keyPresses.size());
                                printf("[+] Search took %4.3f seconds\n", toSeconds(tStart, tEnd));
                            }

                            int n = keyPresses.size();

                            TSimilarityMap similarityMap;
                            {
                                const auto tStart = std::chrono::high_resolution_clock::now();

                                printf("[+] Calculating CC similarity map\n");

                                if (calculateSimilartyMap(kKeyWidth_samples, kKeyAlign_samples, kKeyWidth_samples - kKeyOffset_samples, keyPresses, similarityMap) == false) {
                                    printf("Failed to calculate similariy map\n");
                                    return;
                                }

                                const auto tEnd = std::chrono::high_resolution_clock::now();

                                printf("[+] Calculation took %4.3f seconds\n", toSeconds(tStart, tEnd));

                                {
                                    const auto tStart = std::chrono::high_resolution_clock::now();

                                    printf("[+] Removing low-similarity keys\n");

                                    const int n0 = keyPresses.size();

                                    if (removeLowSimilarityKeys(keyPresses, similarityMap, 0.3f) == false) {
                                        printf("Failed to remove low-similarity keys\n");
                                        return;
                                    }

                                    const int n1 = keyPresses.size();

                                    const auto tEnd = std::chrono::high_resolution_clock::now();

                                    printf("[+] Removed %d low-similarity keys, took %4.3f seconds\n", n0 - n1, toSeconds(tStart, tEnd));
                                }

                                n = keyPresses.size();

                                if (n > 0) {
                                    const int ncc = std::min(32, n);
                                    for (int j = 0; j < ncc; ++j) {
                                        printf("%2d: ", j);
                                        for (int i = 0; i < ncc; ++i) {
                                            printf("%6.3f ", similarityMap[j][i].cc);
                                        }
                                        printf("\n");
                                    }
                                    printf("\n");

                                    auto minCC = similarityMap[0][1].cc;
                                    auto maxCC = similarityMap[0][1].cc;
                                    for (int j = 0; j < n - 1; ++j) {
                                        for (int i = j + 1; i < n; ++i) {
                                            minCC = std::min(minCC, similarityMap[j][i].cc);
                                            maxCC = std::max(maxCC, similarityMap[j][i].cc);
                                        }
                                    }

                                    printf("[+] Similarity map: min = %g, max = %g\n", minCC, maxCC);
                                }
                            }

                            if (n > 0) {
                                const int nThread = std::min(8, std::max(1, int(std::thread::hardware_concurrency()) - 2));

                                printf("[+] Attempting to recover the text from the recording, nThreads = %d\n", nThread);

                                for (int iMain = 0; iMain < 16; ++iMain) {
                                    Cipher::Processor processor;

                                    Cipher::TParameters params;
                                    params.maxClusters = 30;
                                    params.wEnglishFreq = 30.0;
                                    params.fSpread = 0.5 + 0.1*iMain;
                                    params.nHypothesesToKeep = std::max(100, 500 - 2*std::min(200, std::max(0, ((int) keyPresses.size() - 100))));
                                    processor.init(params, state.decoding.freqMap6, similarityMap);


                                    std::vector<Cipher::TResult> clusterings;

                                    // clustering
                                    {
                                        const auto tStart = std::chrono::high_resolution_clock::now();

                                        for (int nIter = 0; nIter < 8; ++nIter) {
                                            auto clusteringsCur = processor.getClusterings(2);

                                            for (int i = 0; i < (int) clusteringsCur.size(); ++i) {
                                                clusterings.push_back(std::move(clusteringsCur[i]));
                                            }

                                            params.maxClusters = 30 + 8*(nIter + 1);
                                            processor.init(params, state.decoding.freqMap6, similarityMap);
                                        }

                                        const auto tEnd = std::chrono::high_resolution_clock::now();
                                        printf("[+] Clustering took %4.3f seconds, fSpread = %g\n", toSeconds(tStart, tEnd), params.fSpread);
                                    }

                                    params.hint.clear();
                                    params.hint.resize(n, -1);

                                    // beam search
                                    {
                                        std::vector<std::thread> workers(std::min(nThread, (int) clusterings.size()));

                                        std::mutex mutexPrint;
                                        for (int i = 0; i < nThread; ++i) {
                                            workers[i] = std::thread([&, i]() {
                                                for (int j = i; j < (int) clusterings.size(); j += nThread) {
                                                    Cipher::beamSearch(params, state.decoding.freqMap6, clusterings[j]);
                                                    mutexPrint.lock();
                                                    printf(" ");
                                                    Cipher::printDecoded(clusterings[j].clusters, clusterings[j].clMap, params.hint);
                                                    printf(" [%8.3f %8.3f]\n", clusterings[j].p, clusterings[j].pClusters);
                                                    mutexPrint.unlock();

                                                    if (state.decoding.interrupt) {
                                                        break;
                                                    }
                                                }
                                            });
                                        }

                                        for (auto& worker : workers) {
                                            worker.join();
                                        }

                                        if (state.decoding.interrupt) {
                                            printf("\n[!] Analysis interrupted\n");
                                            break;
                                        }
                                    }
                                }
                            } else {
                                printf("[!] No keys found\n");
                            }

                            printf("[+] Done\n");
                            state.dataOutput = "done";
                            state.workDone = true;
                        });
                    }

                    if (state.workDone) {
                        state.worker.join();
                        state.state = State::Idle;
                    }
                } break;
            default:
                break;
        };

        return true;
    };

    return true;
}